

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O0

void __thiscall
webrtc::NoiseSuppressionImpl::AnalyzeCaptureAudio(NoiseSuppressionImpl *this,AudioBuffer *audio)

{
  ostream *poVar1;
  size_type sVar2;
  reference this_00;
  pointer this_01;
  NsState *NS_inst;
  float **ppfVar3;
  ulong local_4e8;
  size_t i;
  size_t local_368;
  size_type local_360;
  string *local_358;
  string *_result_1;
  size_t local_1d8;
  uint local_1cc;
  string *local_1c8;
  string *_result;
  CritScope local_1b8;
  CritScope cs;
  FatalMessage local_198;
  FatalMessageVoidify local_19;
  AudioBuffer *local_18;
  AudioBuffer *audio_local;
  NoiseSuppressionImpl *this_local;
  
  local_18 = audio;
  audio_local = (AudioBuffer *)this;
  if (audio == (AudioBuffer *)0x0) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_19);
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
               ,0x47);
    poVar1 = rtc::FatalMessage::stream(&local_198);
    poVar1 = std::operator<<(poVar1,"Check failed: audio");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"# ");
    rtc::FatalMessageVoidify::operator&(&local_19,poVar1);
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  rtc::CritScope::CritScope(&local_1b8,this->crit_);
  if ((this->enabled_ & 1U) == 0) {
    _result._4_4_ = 1;
  }
  else {
    local_1cc = 0xa0;
    local_1d8 = AudioBuffer::num_frames_per_band(local_18);
    local_1c8 = rtc::CheckGEImpl<unsigned_int,unsigned_long>
                          (&local_1cc,&local_1d8,"160u >= audio->num_frames_per_band()");
    if (local_1c8 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)&_result_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
                 ,0x4e,local_1c8);
      rtc::FatalMessage::stream((FatalMessage *)&_result_1);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
    }
    local_360 = std::
                vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                ::size(&this->suppressors_);
    local_368 = AudioBuffer::num_channels(local_18);
    local_358 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                          (&local_360,&local_368,"suppressors_.size() == audio->num_channels()");
    if (local_358 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)&i,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
                 ,0x4f,local_358);
      rtc::FatalMessage::stream((FatalMessage *)&i);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)&i);
    }
    local_358 = (string *)0x0;
    for (local_4e8 = 0;
        sVar2 = std::
                vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                ::size(&this->suppressors_), local_4e8 < sVar2; local_4e8 = local_4e8 + 1) {
      this_00 = std::
                vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                ::operator[](&this->suppressors_,local_4e8);
      this_01 = std::
                unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                ::operator->(this_00);
      NS_inst = Suppressor::state(this_01);
      ppfVar3 = AudioBuffer::split_bands_const_f(local_18,local_4e8);
      WebRtcNs_Analyze(NS_inst,*ppfVar3);
    }
    _result._4_4_ = 0;
  }
  rtc::CritScope::~CritScope(&local_1b8);
  return;
}

Assistant:

void NoiseSuppressionImpl::AnalyzeCaptureAudio(AudioBuffer* audio) {
  RTC_DCHECK(audio);
#if defined(WEBRTC_NS_FLOAT)
  rtc::CritScope cs(crit_);
  if (!enabled_) {
    return;
  }

  RTC_DCHECK_GE(160u, audio->num_frames_per_band());
  RTC_DCHECK_EQ(suppressors_.size(), audio->num_channels());
  for (size_t i = 0; i < suppressors_.size(); i++) {
    WebRtcNs_Analyze(suppressors_[i]->state(),
                     audio->split_bands_const_f(i)[kBand0To8kHz]);
  }
#endif
}